

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

Node * __thiscall
TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::GetNode
          (TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> *this,FName *key)

{
  TValueTraits<int> local_31;
  FName local_30;
  TValueTraits<int> traits;
  Node *n;
  FName *key_local;
  TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> *this_local;
  
  FName::FName((FName *)&stack0xffffffffffffffd4,key);
  this_local = (TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> *)
               FindKey(this,(FName *)&stack0xffffffffffffffd4);
  if (this_local == (TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> *)0x0) {
    FName::FName(&local_30,key);
    this_local = (TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> *)NewKey(this,&local_30);
    TValueTraits<int>::Init(&local_31,&((IPair *)&this_local->LastFree)->Value);
  }
  return (Node *)this_local;
}

Assistant:

Node *GetNode(const KT key)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			return n;
		}
		n = NewKey(key);
		ValueTraits traits;
		traits.Init(n->Pair.Value);
		return n;
	}